

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O2

ngx_int_t ngx_http_read_discarded_request_body(ngx_http_request_t *r)

{
  undefined1 *puVar1;
  ngx_log_t *log;
  ngx_connection_t *pnVar2;
  ssize_t sVar3;
  ngx_int_t nVar4;
  size_t sVar5;
  u_char local_1088 [8];
  u_char buffer [4096];
  ngx_buf_t b;
  
  log = r->connection->log;
  if ((log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,log,0,"http read discarded body");
  }
  buffer[0xff8] = '\0';
  buffer[0xff9] = '\0';
  buffer[0xffa] = '\0';
  buffer[0xffb] = '\0';
  buffer[0xffc] = '\0';
  buffer[0xffd] = '\0';
  buffer[0xffe] = '\0';
  buffer[0xfff] = '\0';
  while( true ) {
    sVar5 = (r->headers_in).content_length_n;
    if (sVar5 == 0) {
      r->read_event_handler = ngx_http_block_reading;
      return 0;
    }
    pnVar2 = r->connection;
    if ((pnVar2->read->field_0x8 & 0x20) == 0) {
      return -2;
    }
    if (0xfff < (long)sVar5) {
      sVar5 = 0x1000;
    }
    sVar3 = (*pnVar2->recv)(pnVar2,local_1088,sVar5);
    if (sVar3 == -2) {
      return -2;
    }
    if (sVar3 == 0) {
      return 0;
    }
    if (sVar3 == -1) break;
    buffer._4088_8_ = local_1088;
    nVar4 = ngx_http_discard_request_body_filter(r,(ngx_buf_t *)(buffer + 0xff8));
    if (nVar4 != 0) {
      return nVar4;
    }
  }
  puVar1 = &r->connection->field_0xd8;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_read_discarded_request_body(ngx_http_request_t *r)
{
    size_t     size;
    ssize_t    n;
    ngx_int_t  rc;
    ngx_buf_t  b;
    u_char     buffer[NGX_HTTP_DISCARD_BUFFER_SIZE];

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http read discarded body");

    ngx_memzero(&b, sizeof(ngx_buf_t));

    b.temporary = 1;

    for ( ;; ) {
        if (r->headers_in.content_length_n == 0) {
            r->read_event_handler = ngx_http_block_reading;
            return NGX_OK;
        }

        if (!r->connection->read->ready) {
            return NGX_AGAIN;
        }

        size = (size_t) ngx_min(r->headers_in.content_length_n,
                                NGX_HTTP_DISCARD_BUFFER_SIZE);

        n = r->connection->recv(r->connection, buffer, size);

        if (n == NGX_ERROR) {
            r->connection->error = 1;
            return NGX_OK;
        }

        if (n == NGX_AGAIN) {
            return NGX_AGAIN;
        }

        if (n == 0) {
            return NGX_OK;
        }

        b.pos = buffer;
        b.last = buffer + n;

        rc = ngx_http_discard_request_body_filter(r, &b);

        if (rc != NGX_OK) {
            return rc;
        }
    }
}